

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caffe.pb.cc
# Opt level: O0

void __thiscall caffe::Datum::SerializeWithCachedSizes(Datum *this,CodedOutputStream *output)

{
  uint uVar1;
  bool value;
  int32 iVar2;
  int iVar3;
  string *value_00;
  UnknownFieldSet *unknown_fields;
  float value_01;
  int local_40;
  int n;
  int i;
  uint32 cached_has_bits;
  CodedOutputStream *output_local;
  Datum *this_local;
  
  uVar1 = (this->_has_bits_).has_bits_[0];
  if ((uVar1 & 2) != 0) {
    iVar2 = channels(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(1,iVar2,output);
  }
  if ((uVar1 & 4) != 0) {
    iVar2 = height(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(2,iVar2,output);
  }
  if ((uVar1 & 8) != 0) {
    iVar2 = width(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(3,iVar2,output);
  }
  if ((uVar1 & 1) != 0) {
    value_00 = data_abi_cxx11_(this);
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(4,value_00,output);
  }
  if ((uVar1 & 0x10) != 0) {
    iVar2 = label(this);
    google::protobuf::internal::WireFormatLite::WriteInt32(5,iVar2,output);
  }
  local_40 = 0;
  iVar3 = float_data_size(this);
  for (; local_40 < iVar3; local_40 = local_40 + 1) {
    value_01 = float_data(this,local_40);
    google::protobuf::internal::WireFormatLite::WriteFloat(6,value_01,output);
  }
  if ((uVar1 & 0x20) != 0) {
    value = encoded(this);
    google::protobuf::internal::WireFormatLite::WriteBool(7,value,output);
  }
  if (((uint)(this->_internal_metadata_).
             super_InternalMetadataWithArenaBase<google::protobuf::UnknownFieldSet,_google::protobuf::internal::InternalMetadataWithArena>
             .ptr_ & 1) == 1) {
    unknown_fields = Datum::unknown_fields(this);
    google::protobuf::internal::WireFormat::SerializeUnknownFields(unknown_fields,output);
  }
  return;
}

Assistant:

void Datum::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:caffe.Datum)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  cached_has_bits = _has_bits_[0];
  // optional int32 channels = 1;
  if (cached_has_bits & 0x00000002u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(1, this->channels(), output);
  }

  // optional int32 height = 2;
  if (cached_has_bits & 0x00000004u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(2, this->height(), output);
  }

  // optional int32 width = 3;
  if (cached_has_bits & 0x00000008u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(3, this->width(), output);
  }

  // optional bytes data = 4;
  if (cached_has_bits & 0x00000001u) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      4, this->data(), output);
  }

  // optional int32 label = 5;
  if (cached_has_bits & 0x00000010u) {
    ::google::protobuf::internal::WireFormatLite::WriteInt32(5, this->label(), output);
  }

  // repeated float float_data = 6;
  for (int i = 0, n = this->float_data_size(); i < n; i++) {
    ::google::protobuf::internal::WireFormatLite::WriteFloat(
      6, this->float_data(i), output);
  }

  // optional bool encoded = 7 [default = false];
  if (cached_has_bits & 0x00000020u) {
    ::google::protobuf::internal::WireFormatLite::WriteBool(7, this->encoded(), output);
  }

  if (_internal_metadata_.have_unknown_fields()) {
    ::google::protobuf::internal::WireFormat::SerializeUnknownFields(
        unknown_fields(), output);
  }
  // @@protoc_insertion_point(serialize_end:caffe.Datum)
}